

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O1

int Ga2_ManMarkup(Gia_Man_t *p,int N,int fSimple)

{
  ulong *puVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *vLeaves;
  int *piVar5;
  long lVar6;
  Vec_Int_t *pVVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  Gia_Obj_t *pGVar17;
  uint *puVar18;
  
  vLeaves = (Vec_Int_t *)malloc(0x10);
  vLeaves->nCap = 100;
  vLeaves->nSize = 0;
  piVar5 = (int *)malloc(400);
  vLeaves->pArray = piVar5;
  if (fSimple == 0) {
    if (0 < p->nObjs) {
      lVar10 = 0;
      lVar6 = 0;
      do {
        pGVar17 = p->pObjs;
        if (pGVar17 == (Gia_Obj_t *)0x0) break;
        *(undefined4 *)((long)&pGVar17->Value + lVar10) = 0;
        uVar12 = *(ulong *)(&pGVar17->field_0x0 + lVar10);
        if ((uVar12 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar12) {
          pGVar4 = (Gia_Obj_t *)(&pGVar17->field_0x0 + lVar10);
          piVar5 = (int *)((long)pGVar17 +
                          lVar10 + 8 + (ulong)(uint)((int)(uVar12 & 0x1fffffff) << 2) * -3);
          *piVar5 = *piVar5 + 1;
          piVar5 = (int *)((long)pGVar17 +
                          lVar10 + 8 + (ulong)((uint)(uVar12 >> 0x1e) & 0x7ffffffc) * -3);
          *piVar5 = *piVar5 + 1;
          iVar16 = Gia_ObjIsMuxType(pGVar4);
          if (iVar16 != 0) {
            uVar12 = *(ulong *)(&pGVar17->field_0x0 + lVar10);
            uVar9 = uVar12 & 0x1fffffff;
            uVar11 = (ulong)(uint)((int)uVar9 * 4);
            uVar13 = *(ulong *)((long)pGVar4 + uVar11 * -3);
            piVar5 = (int *)((long)pGVar4 +
                            (8 - ((ulong)(((uint)uVar13 & 0x1fffffff) << 2) * 3 + uVar9 * 0xc)));
            *piVar5 = *piVar5 + 1;
            piVar5 = (int *)((long)pGVar4 + (8 - ((uVar13 >> 0x1e & 0x7ffffffc) * 3 + uVar11 * 3)));
            *piVar5 = *piVar5 + 1;
            uVar12 = (ulong)(((uint)(uVar12 >> 0x20) & 0x1fffffff) << 2);
            lVar15 = uVar12 * 3;
            uVar12 = *(ulong *)((long)pGVar4 + uVar12 * -3);
            piVar5 = (int *)((long)pGVar4 +
                            (8 - ((ulong)(((uint)uVar12 & 0x1fffffff) << 2) * 3 + lVar15)));
            *piVar5 = *piVar5 + 1;
            piVar5 = (int *)((long)pGVar4 + (8 - ((uVar12 >> 0x1e & 0x7ffffffc) * 3 + lVar15)));
            *piVar5 = *piVar5 + 1;
          }
        }
        lVar6 = lVar6 + 1;
        lVar10 = lVar10 + 0xc;
      } while (lVar6 < p->nObjs);
    }
    if (0 < p->nObjs) {
      lVar6 = 0;
      lVar10 = 0;
      do {
        pGVar17 = p->pObjs;
        if (pGVar17 == (Gia_Obj_t *)0x0) break;
        uVar12 = *(ulong *)(&pGVar17->field_0x0 + lVar6);
        *(ulong *)(&pGVar17->field_0x0 + lVar6) = uVar12 & 0x7fffffffffffffff;
        if ((uVar12 & 0x1fffffff) == 0x1fffffff || (int)uVar12 < 0) {
          iVar16 = (int)(uVar12 & 0x1fffffff);
          if (-1 < (int)uVar12 || iVar16 == 0x1fffffff) {
            uVar13 = uVar12 | 0x8000000000000000;
            goto LAB_005f2555;
          }
          puVar1 = (ulong *)((long)pGVar17 + lVar6 + (ulong)(uint)(iVar16 << 2) * -3);
          *puVar1 = *puVar1 | 0x8000000000000000;
        }
        else {
          uVar13 = 0;
          if (1 < *(uint *)((long)&pGVar17->Value + lVar6)) {
            uVar13 = 0x8000000000000000;
          }
          uVar13 = uVar13 | uVar12 & 0x7fffffffffffffff;
LAB_005f2555:
          *(ulong *)(&pGVar17->field_0x0 + lVar6) = uVar13;
        }
        lVar10 = lVar10 + 1;
        lVar6 = lVar6 + 0xc;
      } while (lVar10 < p->nObjs);
    }
    if (0 < p->nObjs) {
      lVar10 = 0;
      lVar6 = 0;
      do {
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar17 = (Gia_Obj_t *)(&p->pObjs->field_0x0 + lVar10);
        if ((*(ulong *)pGVar17 & 0x8000000080000000) == 0x8000000000000000 &&
            (~(uint)*(ulong *)pGVar17 & 0x1fffffff) != 0) {
          vLeaves->nSize = 0;
          Ga2_ManCollectLeaves_rec(p,pGVar17,vLeaves,1);
          if (N < vLeaves->nSize) {
            Ga2_ManBreakTree_rec(p,pGVar17,1,N);
          }
        }
        lVar6 = lVar6 + 1;
        lVar10 = lVar10 + 0xc;
      } while (lVar6 < p->nObjs);
    }
  }
  else if (0 < p->nObjs) {
    lVar6 = 0;
    lVar10 = 0;
    do {
      pGVar17 = p->pObjs;
      if (pGVar17 == (Gia_Obj_t *)0x0) break;
      uVar8 = (uint)*(ulong *)(&pGVar17->field_0x0 + lVar6);
      uVar12 = 0x8000000000000000;
      if ((~uVar8 & 0x1fffffff) != 0) {
        uVar12 = 0;
      }
      if (-1 < (int)uVar8) {
        uVar12 = 0x8000000000000000;
      }
      *(ulong *)(&pGVar17->field_0x0 + lVar6) =
           *(ulong *)(&pGVar17->field_0x0 + lVar6) & 0x7fffffffffffffff | uVar12;
      lVar10 = lVar10 + 1;
      lVar6 = lVar6 + 0xc;
    } while (lVar10 < p->nObjs);
  }
  if (p->vMapping != (Vec_Int_t *)0x0) {
    piVar5 = p->vMapping->pArray;
    if (piVar5 != (int *)0x0) {
      free(piVar5);
      p->vMapping->pArray = (int *)0x0;
    }
    if (p->vMapping != (Vec_Int_t *)0x0) {
      free(p->vMapping);
      p->vMapping = (Vec_Int_t *)0x0;
    }
  }
  iVar16 = p->nObjs;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar14 = 0x10;
  if (0xe < iVar16 - 1U) {
    iVar14 = iVar16;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar14;
  if (iVar14 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar14 << 2);
  }
  pVVar7->pArray = piVar5;
  pVVar7->nSize = iVar16;
  if (piVar5 != (int *)0x0) {
    memset(piVar5,0,(long)iVar16 << 2);
  }
  p->vMapping = pVVar7;
  iVar16 = p->nRegs;
  if (0 < iVar16) {
    iVar14 = 0;
LAB_005f26c6:
    iVar2 = p->vCis->nSize;
    uVar8 = iVar14 + (iVar2 - iVar16);
    if (((int)uVar8 < 0) || (iVar2 <= (int)uVar8)) {
LAB_005f2a3a:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar3 = p->vCis->pArray[uVar8];
    lVar6 = (long)iVar3;
    if ((lVar6 < 0) || (p->nObjs <= iVar3)) {
LAB_005f29fc:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar17 = p->pObjs;
    if (pGVar17 != (Gia_Obj_t *)0x0) {
      lVar10 = *(long *)(pGVar17 + lVar6);
      if (((~(uint)lVar10 & 0x9fffffff) != 0) ||
         (uVar8 = (uint)((ulong)lVar10 >> 0x20) & 0x1fffffff, (int)uVar8 < iVar2 - iVar16)) {
        __assert_fail("Gia_ObjIsRo(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar16 = p->vCos->nSize;
      uVar8 = (iVar16 - iVar2) + uVar8;
      if (((int)uVar8 < 0) || (iVar16 <= (int)uVar8)) goto LAB_005f2a3a;
      iVar16 = p->vCos->pArray[uVar8];
      if (((long)iVar16 < 0) || (p->nObjs <= iVar16)) goto LAB_005f29fc;
      if (-1 < lVar10) {
        __assert_fail("pObj->fPhase",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                      ,0x12f,"int Ga2_ManMarkup(Gia_Man_t *, int, int)");
      }
      pGVar17 = pGVar17 + iVar16;
      if (-1 < *(long *)(pGVar17 + -(ulong)((uint)*(undefined8 *)pGVar17 & 0x1fffffff))) {
        __assert_fail("Gia_ObjFanin0(pObjRi)->fPhase",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                      ,0x130,"int Ga2_ManMarkup(Gia_Man_t *, int, int)");
      }
      pVVar7 = p->vMapping;
      if (pVVar7->nSize <= iVar3) goto LAB_005f2a97;
      pVVar7->pArray[lVar6] = pVVar7->nSize;
      Vec_IntPush(pVVar7,1);
      pGVar4 = p->pObjs;
      if ((pGVar17 < pGVar4) || (pGVar4 + p->nObjs <= pGVar17)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p->vMapping,
                  (int)((ulong)((long)pGVar17 - (long)pGVar4) >> 2) * -0x55555555 -
                  (*(uint *)pGVar17 & 0x1fffffff));
      iVar16 = 0x55555555;
      if ((*(uint *)pGVar17 >> 0x1d & 1) == 0) {
        iVar16 = -0x55555556;
      }
      Vec_IntPush(p->vMapping,iVar16);
      Vec_IntPush(p->vMapping,-1);
      iVar14 = iVar14 + 1;
      iVar16 = p->nRegs;
      if (iVar14 < iVar16) goto LAB_005f26c6;
    }
  }
  if (0 < p->nObjs) {
    lVar6 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar17 = p->pObjs + lVar6;
      if ((*(ulong *)pGVar17 & 0x8000000080000000) == 0x8000000000000000 &&
          (~(uint)*(ulong *)pGVar17 & 0x1fffffff) != 0) {
        vLeaves->nSize = 0;
        Ga2_ManCollectLeaves_rec(p,pGVar17,vLeaves,1);
        if (N < vLeaves->nSize) {
          __assert_fail("Vec_IntSize(vLeaves) <= N",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                        ,0x13f,"int Ga2_ManMarkup(Gia_Man_t *, int, int)");
        }
        pVVar7 = p->vMapping;
        if (pVVar7->nSize <= lVar6) {
LAB_005f2a97:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        pVVar7->pArray[lVar6] = pVVar7->nSize;
        Vec_IntPush(pVVar7,vLeaves->nSize);
        if (0 < vLeaves->nSize) {
          puVar18 = Ga2_ManComputeTruth::uTruth5;
          lVar10 = 0;
          do {
            iVar14 = vLeaves->pArray[lVar10];
            lVar15 = (long)iVar14;
            Vec_IntPush(p->vMapping,iVar14);
            if ((lVar15 < 0) || (p->nObjs <= iVar14)) goto LAB_005f29fc;
            pGVar4 = p->pObjs;
            pGVar4[lVar15].Value = *puVar18;
            if (-1 < *(long *)(pGVar4 + lVar15)) {
              __assert_fail("Gia_ManObj(p, Leaf)->fPhase",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                            ,0x147,"int Ga2_ManMarkup(Gia_Man_t *, int, int)");
            }
            lVar10 = lVar10 + 1;
            puVar18 = puVar18 + 1;
          } while (lVar10 < vLeaves->nSize);
        }
        pVVar7 = p->vMapping;
        uVar8 = Ga2_ObjComputeTruth_rec(p,pGVar17,1);
        Vec_IntPush(pVVar7,uVar8);
        Vec_IntPush(p->vMapping,-1);
        iVar16 = iVar16 + 1;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < p->nObjs);
  }
  if (vLeaves->pArray != (int *)0x0) {
    free(vLeaves->pArray);
    vLeaves->pArray = (int *)0x0;
  }
  free(vLeaves);
  Gia_ManCleanValue(p);
  return iVar16;
}

Assistant:

int Ga2_ManMarkup( Gia_Man_t * p, int N, int fSimple )
{
    static unsigned uTruth5[5] = { 0xAAAAAAAA, 0xCCCCCCCC, 0xF0F0F0F0, 0xFF00FF00, 0xFFFF0000 };
//    abctime clk = Abc_Clock();
    Vec_Int_t * vLeaves;
    Gia_Obj_t * pObj;
    int i, k, Leaf, CountMarks;

    vLeaves = Vec_IntAlloc( 100 );

    if ( fSimple )
    {
        Gia_ManForEachObj( p, pObj, i )
            pObj->fPhase = !Gia_ObjIsCo(pObj);
    }
    else
    {
        // label nodes with multiple fanouts and inputs MUXes
        Gia_ManForEachObj( p, pObj, i )
        {
            pObj->Value = 0;
            if ( !Gia_ObjIsAnd(pObj) )
                continue;
            Gia_ObjFanin0(pObj)->Value++;
            Gia_ObjFanin1(pObj)->Value++;
            if ( !Gia_ObjIsMuxType(pObj) )
                continue;
            Gia_ObjFanin0(Gia_ObjFanin0(pObj))->Value++;
            Gia_ObjFanin1(Gia_ObjFanin0(pObj))->Value++;
            Gia_ObjFanin0(Gia_ObjFanin1(pObj))->Value++;
            Gia_ObjFanin1(Gia_ObjFanin1(pObj))->Value++;
        }
        Gia_ManForEachObj( p, pObj, i )
        {
            pObj->fPhase = 0;
            if ( Gia_ObjIsAnd(pObj) )
                pObj->fPhase = (pObj->Value > 1);
            else if ( Gia_ObjIsCo(pObj) )
                Gia_ObjFanin0(pObj)->fPhase = 1;
            else 
                pObj->fPhase = 1;
        } 
        // add marks when needed
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( !pObj->fPhase )
                continue;
            Vec_IntClear( vLeaves );
            Ga2_ManCollectLeaves_rec( p, pObj, vLeaves, 1 );
            if ( Vec_IntSize(vLeaves) > N )
                Ga2_ManBreakTree_rec( p, pObj, 1, N );
        }
    }

    // verify that the tree is split correctly
    Vec_IntFreeP( &p->vMapping );
    p->vMapping = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManForEachRo( p, pObj, i )
    {
        Gia_Obj_t * pObjRi = Gia_ObjRoToRi(p, pObj);
        assert( pObj->fPhase );
        assert( Gia_ObjFanin0(pObjRi)->fPhase );
        // create map
        Vec_IntWriteEntry( p->vMapping, Gia_ObjId(p, pObj), Vec_IntSize(p->vMapping) );
        Vec_IntPush( p->vMapping, 1 );
        Vec_IntPush( p->vMapping, Gia_ObjFaninId0p(p, pObjRi) );
        Vec_IntPush( p->vMapping, Gia_ObjFaninC0(pObjRi) ? 0x55555555 : 0xAAAAAAAA );
        Vec_IntPush( p->vMapping, -1 );  // placeholder for ref counter
    }
    CountMarks = Gia_ManRegNum(p);
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !pObj->fPhase )
            continue;
        Vec_IntClear( vLeaves );
        Ga2_ManCollectLeaves_rec( p, pObj, vLeaves, 1 );
        assert( Vec_IntSize(vLeaves) <= N );
        // create map
        Vec_IntWriteEntry( p->vMapping, i, Vec_IntSize(p->vMapping) );
        Vec_IntPush( p->vMapping, Vec_IntSize(vLeaves) );
        Vec_IntForEachEntry( vLeaves, Leaf, k )
        {            
            Vec_IntPush( p->vMapping, Leaf );
            Gia_ManObj(p, Leaf)->Value = uTruth5[k];
            assert( Gia_ManObj(p, Leaf)->fPhase );
        }
        Vec_IntPush( p->vMapping,  (int)Ga2_ObjComputeTruth_rec( p, pObj, 1 ) );
        Vec_IntPush( p->vMapping, -1 );  // placeholder for ref counter
        CountMarks++;
    }
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Vec_IntFree( vLeaves );
    Gia_ManCleanValue( p );
    return CountMarks;
}